

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O3

SW_FT_Error SW_FT_Outline_Check(SW_FT_Outline *outline)

{
  short sVar1;
  short sVar2;
  short sVar3;
  long lVar4;
  short sVar5;
  
  if (outline != (SW_FT_Outline *)0x0) {
    sVar1 = outline->n_contours;
    sVar2 = outline->n_points;
    if (sVar2 == 0 && sVar1 == 0) {
      return 0;
    }
    if (0 < sVar1 && 0 < sVar2) {
      lVar4 = 0;
      sVar5 = -1;
      do {
        sVar3 = outline->contours[lVar4];
        if (sVar2 <= sVar3) {
          return -1;
        }
        if (sVar3 <= sVar5) {
          return -1;
        }
        lVar4 = lVar4 + 1;
        sVar5 = sVar3;
      } while (sVar1 != lVar4);
      if (sVar3 == (short)(sVar2 + -1)) {
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

SW_FT_Error SW_FT_Outline_Check(SW_FT_Outline* outline)
{
    if (outline) {
        SW_FT_Int n_points = outline->n_points;
        SW_FT_Int n_contours = outline->n_contours;
        SW_FT_Int end0, end;
        SW_FT_Int n;

        /* empty glyph? */
        if (n_points == 0 && n_contours == 0) return 0;

        /* check point and contour counts */
        if (n_points <= 0 || n_contours <= 0) goto Bad;

        end0 = end = -1;
        for (n = 0; n < n_contours; n++) {
            end = outline->contours[n];

            /* note that we don't accept empty contours */
            if (end <= end0 || end >= n_points) goto Bad;

            end0 = end;
        }

        if (end != n_points - 1) goto Bad;

        /* XXX: check the tags array */
        return 0;
    }

Bad:
    return -1;  // SW_FT_THROW( Invalid_Argument );
}